

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O3

void __thiscall EefcFlash::waitFSR(EefcFlash *this,int seconds)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 *puVar3;
  pointer_____offset_0x10___ *ppuVar4;
  uint uVar5;
  
  if (0 < seconds) {
    uVar5 = seconds * 1000 + 1;
    uVar2 = 1;
    do {
      uVar1 = Samba::readWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 8
                             );
      if ((uVar1 & 2) != 0) {
LAB_0010e058:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__exception_001187c8;
        ppuVar4 = &FlashCmdError::typeinfo;
LAB_0010e090:
        __cxa_throw(puVar3,ppuVar4,std::exception::~exception);
      }
      if ((uVar1 & 4) != 0) {
LAB_0010e075:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__exception_00118a30;
        ppuVar4 = &FlashLockError::typeinfo;
        goto LAB_0010e090;
      }
      if ((this->super_Flash)._planes == 2) {
        uVar2 = Samba::readWord((this->super_Flash)._samba,
                                *(int *)&(this->super_Flash).field_0xf4 + 0x208);
        if ((uVar2 & 2) != 0) goto LAB_0010e058;
        if ((uVar2 & 4) != 0) goto LAB_0010e075;
      }
      if ((uVar1 & uVar2 & 1) != 0) {
        if (uVar5 != 2) {
          return;
        }
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__exception_00118a58;
        ppuVar4 = &FlashTimeoutError::typeinfo;
        goto LAB_0010e090;
      }
      usleep(1000);
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  return;
}

Assistant:

void
EefcFlash::waitFSR(int seconds)
{
    int tries = seconds * 1000;
    uint32_t fsr0;
    uint32_t fsr1 = 0x1;

    while (tries-- > 0)
    {
        fsr0 = _samba.readWord(EEFC0_FSR);
        if (fsr0 & 0x2)
            throw FlashCmdError();
        if (fsr0 & 0x4)
            throw FlashLockError();

        if (_planes == 2)
        {
            fsr1 = _samba.readWord(EEFC1_FSR);
            if (fsr1 & 0x2)
                throw FlashCmdError();
            if (fsr1 & 0x4)
                throw FlashLockError();
        }
        if (fsr0 & fsr1 & 0x1)
            break;
        usleep(1000);
    }
    if (tries == 0)
        throw FlashTimeoutError();
}